

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

_Bool upb_inttable_sizedinit(upb_inttable *t,uint32_t asize,int hsize_lg2,upb_Arena *a)

{
  uint uVar1;
  uint32_t uVar2;
  size_t __n;
  upb_value *puVar3;
  upb_value *__s;
  uint32_t local_4c;
  void *alloc;
  uintptr_t total_bytes;
  uint32_t presence_bytes;
  size_t array_bytes;
  upb_Arena *a_local;
  int hsize_lg2_local;
  uint32_t asize_local;
  upb_inttable *t_local;
  
  uVar1 = init((EVP_PKEY_CTX *)t);
  if ((uVar1 & 1) == 0) {
    t_local._7_1_ = false;
  }
  else {
    local_4c = asize;
    if (asize == 0) {
      local_4c = 1;
    }
    t->array_size = local_4c;
    t->array_count = 0;
    uVar1 = t->array_size;
    __n = (ulong)uVar1 * 8;
    uVar2 = presence_mask_arr_size(t->array_size);
    puVar3 = (upb_value *)upb_Arena_Malloc(a,__n + uVar2);
    if (puVar3 == (upb_value *)0x0) {
      t_local._7_1_ = false;
    }
    else {
      t->array = puVar3;
      __s = mutable_array(t);
      memset(__s,0xff,__n);
      t->presence_mask = (uint8_t *)(puVar3 + uVar1);
      memset(t->presence_mask,0,(ulong)uVar2);
      check(t);
      t_local._7_1_ = true;
    }
  }
  return t_local._7_1_;
}

Assistant:

bool upb_inttable_sizedinit(upb_inttable* t, uint32_t asize, int hsize_lg2,
                            upb_Arena* a) {
  if (!init(&t->t, hsize_lg2, a)) return false;
  /* Always make the array part at least 1 long, so that we know key 0
   * won't be in the hash part, which simplifies things. */
  t->array_size = UPB_MAX(1, asize);
  t->array_count = 0;
#if UINT32_MAX >= SIZE_MAX
  if (UPB_UNLIKELY(SIZE_MAX / sizeof(upb_value) < t->array_size)) {
    return false;
  }
#endif

  // Allocate the array part and the presence mask array in one allocation.
  size_t array_bytes = t->array_size * sizeof(upb_value);
  uint32_t presence_bytes = presence_mask_arr_size(t->array_size);
  uintptr_t total_bytes = array_bytes + presence_bytes;
  if (UPB_UNLIKELY(total_bytes > SIZE_MAX)) {
    return false;
  }
  void* alloc = upb_Arena_Malloc(a, total_bytes);
  if (!alloc) {
    return false;
  }
  t->array = alloc;
  memset(mutable_array(t), 0xff, array_bytes);
  t->presence_mask = (uint8_t*)alloc + array_bytes;
  memset((uint8_t*)t->presence_mask, 0, presence_bytes);

  check(t);
  return true;
}